

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O2

Am_Value right_of_sibling_procedure(Am_Object *self)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Value *pAVar3;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Flags in_RSI;
  Am_Value AVar4;
  Am_Object object;
  Am_Object local_28;
  Am_Wrapper *this;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  iVar1 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
  this = (Am_Wrapper *)CONCAT44(extraout_var,iVar1);
  Am_Object::Get_Owner(&local_28,in_RSI);
  Am_Object::Get_Object(&object,(Am_Slot_Key)&local_28,(ulong)*(ushort *)&this->field_0xc);
  Am_Object::~Am_Object(&local_28);
  pAVar3 = Am_Object::Get(&object,100,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(&object,0x66,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Value::operator=((Am_Value *)self,iVar2 + iVar1);
  Am_Wrapper::Release(this);
  modify_value((Am_Value *)self,*(int *)&this[1].super_Am_Registered_Type._vptr_Am_Registered_Type,
               *(float *)((long)&this[1].super_Am_Registered_Type._vptr_Am_Registered_Type + 4));
  Am_Object::~Am_Object(&object);
  AVar4.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

static Am_Value
right_of_sibling_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Offset_Store_Data *store =
      (Part_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  Am_Object object = self.Get_Owner().Get_Object(store->part);
  value = (int)object.Get(Am_LEFT) + (int)object.Get(Am_WIDTH);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}